

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

void rgbcx::encode_bc1_pick_initial
               (color32 *pSrc_pixels,uint32_t flags,bool grayscale_flag,int min_r,int min_g,
               int min_b,int max_r,int max_g,int max_b,int avg_r,int avg_g,int avg_b,int total_r,
               int total_g,int total_b,int *lr,int *lg,int *lb,int *hr,int *hg,int *hb)

{
  byte bVar1;
  color32 cVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  uint32_t i;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  undefined7 in_register_00000011;
  uint uVar13;
  int iVar14;
  uint uVar15;
  char cVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  bool bVar21;
  float __tmp_1;
  float fVar22;
  float __tmp;
  float fVar23;
  float fVar25;
  undefined1 auVar24 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint local_84;
  vec3F local_78;
  int local_6c;
  int local_68;
  int local_64;
  float cov [6];
  
  if ((int)CONCAT71(in_register_00000011,grayscale_flag) != 0) {
    if (max_r - min_r < 2) {
      uVar7 = (uint)(pSrc_pixels->field_0).field_0.r;
      iVar8 = uVar7 * 0x1f;
      uVar9 = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
      *hb = uVar9;
      *hr = uVar9;
      *lb = uVar9;
      *lr = uVar9;
      iVar8 = uVar7 * 0x3f;
      uVar7 = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
      *hg = uVar7;
      *lg = uVar7;
      return;
    }
    uVar7 = (min_r * 0x1f + 0x80U >> 8) + min_r * 0x1f + 0x80 >> 8 & 0xff;
    *lb = uVar7;
    *lr = uVar7;
    *lg = min_r * 0x3f + (min_r * 0x3f + 0x80U >> 8) + 0x80 >> 8 & 0xff;
    uVar7 = max_r * 0x1f + (max_r * 0x1f + 0x80U >> 8) + 0x80 >> 8 & 0xff;
    *hb = uVar7;
    *hr = uVar7;
    *hg = max_r * 0x3f + (max_r * 0x3f + 0x80U >> 8) + 0x80 >> 8 & 0xff;
    return;
  }
  if ((flags >> 9 & 1) == 0) {
    if ((flags & 0x40) == 0) {
      if (-1 < (short)flags) {
        local_64 = 0;
        local_68 = 0;
        local_6c = 0;
        local_78.c[2] = 0.0;
        local_78.c[1] = 0.0;
        local_78.c[0] = 0.0;
        for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
          iVar8 = (uint)pSrc_pixels[lVar11].field_0.field_0.r - avg_r;
          iVar14 = (uint)pSrc_pixels[lVar11].field_0.field_0.g - avg_g;
          iVar19 = (uint)pSrc_pixels[lVar11].field_0.field_0.b - avg_b;
          local_78.c[0] = (float)((int)local_78.c[0] + iVar8 * iVar8);
          local_78.c[1] = (float)((int)local_78.c[1] + iVar14 * iVar8);
          local_78.c[2] = (float)((int)local_78.c[2] + iVar8 * iVar19);
          local_6c = local_6c + iVar14 * iVar14;
          local_68 = local_68 + iVar19 * iVar14;
          local_64 = local_64 + iVar19 * iVar19;
        }
        for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
          cov[lVar11] = (float)(int)local_78.c[lVar11] * 0.003921569;
        }
        fVar27 = -(float)(max_r - min_r);
        if (-1 < (int)local_78.c[2]) {
          fVar27 = (float)(max_r - min_r);
        }
        fVar26 = (float)(max_b - min_b);
        fVar23 = -(float)(max_g - min_g);
        if (-1 < local_68) {
          fVar23 = (float)(max_g - min_g);
        }
        uVar7 = flags >> 10 & 2 | 4;
        while (bVar21 = uVar7 != 0, uVar7 = uVar7 - 1, bVar21) {
          fVar28 = fVar23 * cov[1];
          fVar29 = fVar26 * cov[2];
          fVar22 = fVar23 * (float)cov._16_8_;
          fVar23 = fVar26 * (float)cov._16_8_ + fVar27 * cov[1] + fVar23 * cov[3];
          fVar26 = fVar26 * SUB84(cov._16_8_,4) + fVar27 * cov[2] + fVar22;
          fVar27 = fVar29 + fVar27 * cov[0] + fVar28;
        }
        fVar22 = ABS(fVar27);
        if (ABS(fVar27) <= ABS(fVar23)) {
          fVar22 = ABS(fVar23);
        }
        if (fVar22 <= ABS(fVar26)) {
          fVar22 = ABS(fVar26);
        }
        if (2.0 <= fVar22) {
          fVar22 = 2048.0 / fVar22;
          iVar8 = (int)(fVar27 * fVar22) << 4;
          iVar14 = (int)(fVar23 * fVar22) << 4;
          iVar19 = (int)(fVar26 * fVar22) << 4;
        }
        else {
          iVar14 = 0x2590;
          iVar19 = 0x750;
          iVar8 = 0x1320;
        }
        uVar7 = 0x7fffffff;
        uVar9 = 0x80000000;
        for (uVar18 = 0; uVar18 < 0x10; uVar18 = uVar18 + 4) {
          iVar17 = (int)uVar18;
          uVar13 = (uint)pSrc_pixels[uVar18].field_0.field_0.r * iVar8 + iVar17 +
                   (uint)pSrc_pixels[uVar18].field_0.field_0.b * iVar19 +
                   (uint)pSrc_pixels[uVar18].field_0.field_0.g * iVar14;
          uVar10 = iVar17 + (uint)pSrc_pixels[uVar18 + 1].field_0.field_0.b * iVar19 +
                            (uint)pSrc_pixels[uVar18 + 1].field_0.field_0.g * iVar14 +
                            (uint)pSrc_pixels[uVar18 + 1].field_0.field_0.r * iVar8 + 1;
          uVar12 = iVar17 + (uint)pSrc_pixels[uVar18 + 2].field_0.field_0.b * iVar19 +
                            (uint)pSrc_pixels[uVar18 + 2].field_0.field_0.g * iVar14 +
                            (uint)pSrc_pixels[uVar18 + 2].field_0.field_0.r * iVar8 + 2;
          uVar15 = iVar17 + (uint)pSrc_pixels[uVar18 + 3].field_0.field_0.b * iVar19 +
                            (uint)pSrc_pixels[uVar18 + 3].field_0.field_0.g * iVar14 +
                            (uint)pSrc_pixels[uVar18 + 3].field_0.field_0.r * iVar8 + 3;
          uVar20 = uVar13;
          if ((int)uVar13 <= (int)uVar10) {
            uVar20 = uVar10;
            uVar10 = uVar13;
          }
          uVar13 = uVar15;
          if ((int)uVar15 < (int)uVar12) {
            uVar13 = uVar12;
            uVar12 = uVar15;
          }
          if ((int)uVar10 <= (int)uVar12) {
            uVar12 = uVar10;
          }
          if ((int)uVar13 < (int)uVar20) {
            uVar13 = uVar20;
          }
          if ((int)uVar12 < (int)uVar7) {
            uVar7 = uVar12;
          }
          if ((int)uVar9 <= (int)uVar13) {
            uVar9 = uVar13;
          }
        }
        uVar7 = uVar7 & 0xf;
        uVar9 = uVar9 & 0xf;
        iVar8 = (uint)pSrc_pixels[uVar7].field_0.field_0.r * 0x1f;
        *lr = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
        iVar8 = (uint)pSrc_pixels[uVar7].field_0.field_0.g * 0x3f;
        *lg = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
        iVar8 = (uint)pSrc_pixels[uVar7].field_0.field_0.b * 0x1f;
        *lb = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
        iVar8 = (uint)pSrc_pixels[uVar9].field_0.field_0.r * 0x1f;
        *hr = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
        iVar8 = (uint)pSrc_pixels[uVar9].field_0.field_0.g * 0x3f;
        *hg = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
        iVar8 = (uint)pSrc_pixels[uVar9].field_0.field_0.b * 0x1f;
        *hb = iVar8 + (iVar8 + 0x80U >> 8) + 0x80 >> 8;
        return;
      }
      iVar19 = (max_r - min_r) + -8 >> 4;
      iVar14 = (max_g - min_g) + -8 >> 4;
      iVar8 = (max_b - min_b) + -8 >> 4;
      uVar7 = min_r + iVar19;
      local_84 = min_g + iVar14;
      uVar20 = min_b + iVar8;
      uVar9 = uVar20;
      if (0xff < (local_84 | uVar7 | uVar20)) {
        uVar9 = 0xff;
        if (uVar7 < 0xff) {
          uVar9 = uVar7;
        }
        bVar21 = (int)uVar7 < 0;
        uVar7 = uVar9;
        if (bVar21) {
          uVar7 = 0;
        }
        uVar9 = 0xff;
        if (local_84 < 0xff) {
          uVar9 = local_84;
        }
        bVar21 = (int)local_84 < 0;
        local_84 = uVar9;
        if (bVar21) {
          local_84 = 0;
        }
        uVar9 = 0xff;
        if (uVar20 < 0xff) {
          uVar9 = uVar20;
        }
        if ((int)uVar20 < 0) {
          uVar9 = 0;
        }
      }
      uVar10 = max_r - iVar19;
      uVar20 = max_g - iVar14;
      uVar13 = max_b - iVar8;
      uVar12 = uVar13;
      if (0xff < (uVar20 | uVar10 | uVar13)) {
        uVar12 = 0xff;
        if (uVar10 < 0xff) {
          uVar12 = uVar10;
        }
        uVar15 = 0;
        bVar21 = (int)uVar10 < 0;
        uVar10 = uVar12;
        if (bVar21) {
          uVar10 = uVar15;
        }
        uVar12 = 0xff;
        if (uVar20 < 0xff) {
          uVar12 = uVar20;
        }
        bVar21 = (int)uVar20 < 0;
        uVar20 = uVar12;
        if (bVar21) {
          uVar20 = uVar15;
        }
        uVar12 = 0xff;
        if (uVar13 < 0xff) {
          uVar12 = uVar13;
        }
        if ((int)uVar13 < 0) {
          uVar12 = uVar15;
        }
      }
      iVar14 = 0;
      iVar8 = 0;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        iVar19 = (uint)pSrc_pixels[lVar11].field_0.field_0.b - avg_b;
        iVar14 = iVar14 + ((uint)pSrc_pixels[lVar11].field_0.field_0.r - avg_r) * iVar19;
        iVar8 = iVar8 + iVar19 * ((uint)pSrc_pixels[lVar11].field_0.field_0.g - avg_g);
      }
      uVar13 = uVar7;
      if (iVar14 < 0) {
        uVar13 = uVar10;
        uVar10 = uVar7;
      }
      uVar7 = local_84;
      if (iVar8 < 0) {
        uVar7 = uVar20;
        uVar20 = local_84;
      }
      *lr = (uVar13 * 0x1f + 0x80 >> 8) + uVar13 * 0x1f + 0x80 >> 8 & 0xff;
      *lg = uVar7 * 0x3f + (uVar7 * 0x3f + 0x80 >> 8) + 0x80 >> 8 & 0xff;
      *lb = uVar9 * 0x1f + (uVar9 * 0x1f + 0x80 >> 8) + 0x80 >> 8 & 0xff;
      *hr = uVar10 * 0x1f + (uVar10 * 0x1f + 0x80 >> 8) + 0x80 >> 8 & 0xff;
      *hg = uVar20 * 0x3f + (uVar20 * 0x3f + 0x80 >> 8) + 0x80 >> 8 & 0xff;
      *hb = (uVar12 * 0x1f + 0x80 >> 8) + uVar12 * 0x1f + 0x80 >> 8 & 0xff;
      return;
    }
    fVar23 = (((float)max_r * 0.003921569 - (float)min_r * 0.003921569) + -0.03137255) * 0.0625;
    fVar27 = (((float)max_g * 0.003921569 - (float)min_g * 0.003921569) + -0.03137255) * 0.0625;
    fVar26 = (float)min_r * 0.003921569 + fVar23;
    local_78.c[0] = 0.0;
    if ((0.0 <= fVar26) && (local_78.c[0] = fVar26, 1.0 < fVar26)) {
      local_78.c[0] = 1.0;
    }
    fVar26 = (((float)max_b * 0.003921569 - (float)min_b * 0.003921569) + -0.03137255) * 0.0625;
    fVar22 = (float)min_g * 0.003921569 + fVar27;
    local_78.c[1] = 0.0;
    if ((0.0 <= fVar22) && (local_78.c[1] = fVar22, 1.0 < fVar22)) {
      local_78.c[1] = 1.0;
    }
    fVar22 = (float)min_b * 0.003921569 + fVar26;
    local_78.c[2] = 0.0;
    if ((0.0 <= fVar22) && (local_78.c[2] = fVar22, 1.0 < fVar22)) {
      local_78.c[2] = 1.0;
    }
    fVar23 = (float)max_r * 0.003921569 - fVar23;
    fVar22 = 0.0;
    if ((0.0 <= fVar23) && (fVar22 = fVar23, 1.0 < fVar23)) {
      fVar22 = 1.0;
    }
    fVar27 = (float)max_g * 0.003921569 - fVar27;
    fVar23 = 0.0;
    if ((0.0 <= fVar27) && (fVar23 = fVar27, 1.0 < fVar27)) {
      fVar23 = 1.0;
    }
    fVar26 = (float)max_b * 0.003921569 - fVar26;
    cov[2] = 0.0;
    if ((0.0 <= fVar26) && (cov[2] = fVar26, 1.0 < fVar26)) {
      cov[2] = 1.0;
    }
    iVar14 = 0;
    iVar8 = 0;
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      iVar19 = (uint)pSrc_pixels[lVar11].field_0.field_0.b - avg_b;
      iVar14 = iVar14 + ((uint)pSrc_pixels[lVar11].field_0.field_0.r - avg_r) * iVar19;
      iVar8 = iVar8 + iVar19 * ((uint)pSrc_pixels[lVar11].field_0.field_0.g - avg_g);
    }
    cov[0] = fVar22;
    if (iVar14 < 0) {
      cov[0] = local_78.c[0];
      local_78.c[0] = fVar22;
    }
    cov[1] = fVar23;
    if (iVar8 < 0) {
      cov[1] = local_78.c[1];
      local_78.c[1] = fVar23;
    }
    goto LAB_00117bc6;
  }
  iVar14 = max_g - min_g;
  iVar8 = max_r - min_r;
  if (iVar8 < iVar14) {
    max_r = max_g;
  }
  if (iVar8 < iVar14) {
    min_r = min_g;
  }
  iVar19 = max_r - min_r;
  if (iVar19 < max_b - min_b) {
    min_r = min_b;
    max_r = max_b;
  }
  cVar16 = '\x02';
  if (max_b - min_b <= iVar19) {
    cVar16 = iVar8 < iVar14;
  }
  if (cVar16 == '\0') {
    iVar8 = 0;
    iVar14 = 0;
    iVar19 = 0;
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      bVar1 = pSrc_pixels[lVar11].field_0.field_0.r;
      iVar19 = iVar19 + (uint)bVar1 * (uint)bVar1;
      iVar14 = iVar14 + (uint)pSrc_pixels[lVar11].field_0.field_0.g * (uint)bVar1;
      iVar8 = iVar8 + (uint)pSrc_pixels[lVar11].field_0.field_0.b * (uint)bVar1;
    }
    fVar26 = (float)(iVar19 * 0x10 - total_r * total_r);
    fVar27 = 0.0;
    fVar23 = 0.0;
    if (1e-08 < ABS(fVar26)) {
      fVar26 = 1.0 / fVar26;
      fVar23 = (float)(iVar14 * 0x10 - total_g * total_r) * fVar26;
      fVar27 = (float)(iVar8 * 0x10 - total_b * total_r) * fVar26;
    }
    fVar26 = ((float)total_g - fVar23 * (float)total_r) * 0.0625;
    fVar29 = ((float)total_b - (float)total_r * fVar27) * 0.0625;
    fVar22 = (float)min_r;
    fVar28 = fVar23 * fVar22 + fVar26;
    local_78.c[2] = fVar27 * fVar22 + fVar29;
    fVar26 = (fVar23 * (float)max_r + fVar26) - fVar28;
    fVar27 = (fVar27 * (float)max_r + fVar29) - local_78.c[2];
    fVar23 = fVar27 * 0.9375 + local_78.c[2];
    local_78.c[2] = fVar27 * 0.0625 + local_78.c[2];
    fVar27 = (float)(max_r - min_r);
LAB_00117a32:
    fVar29 = fVar27 * 0.0625 + fVar22;
    fVar25 = fVar26 * 0.0625 + fVar28;
    fVar22 = fVar27 * 0.9375 + fVar22;
    fVar28 = fVar26 * 0.9375 + fVar28;
  }
  else {
    if (cVar16 == '\x01') {
      iVar8 = 0;
      iVar19 = 0;
      iVar14 = 0;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        bVar1 = pSrc_pixels[lVar11].field_0.field_0.g;
        iVar14 = iVar14 + (uint)pSrc_pixels[lVar11].field_0.field_0.r * (uint)bVar1;
        iVar19 = iVar19 + (uint)bVar1 * (uint)bVar1;
        iVar8 = iVar8 + (uint)pSrc_pixels[lVar11].field_0.field_0.b * (uint)bVar1;
      }
      fVar26 = (float)(iVar19 * 0x10 - total_g * total_g);
      fVar23 = 0.0;
      fVar27 = 0.0;
      if (1e-08 < ABS(fVar26)) {
        fVar26 = 1.0 / fVar26;
        fVar27 = (float)(iVar14 * 0x10 - total_g * total_r) * fVar26;
        fVar23 = (float)(iVar8 * 0x10 - total_b * total_g) * fVar26;
      }
      fVar26 = ((float)total_r - fVar27 * (float)total_g) * 0.0625;
      fVar29 = ((float)total_b - (float)total_g * fVar23) * 0.0625;
      fVar28 = (float)min_r;
      fVar22 = fVar27 * fVar28 + fVar26;
      local_78.c[2] = fVar23 * fVar28 + fVar29;
      fVar27 = (fVar27 * (float)max_r + fVar26) - fVar22;
      fVar26 = (fVar23 * (float)max_r + fVar29) - local_78.c[2];
      fVar23 = fVar26 * 0.9375 + local_78.c[2];
      local_78.c[2] = fVar26 * 0.0625 + local_78.c[2];
      fVar26 = (float)(max_r - min_r);
      goto LAB_00117a32;
    }
    iVar8 = 0;
    iVar14 = 0;
    iVar19 = 0;
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      cVar2.field_0 =
           (anon_union_4_3_898e29d3_for_color32_0)
           *(anon_union_4_3_898e29d3_for_color32_0 *)&pSrc_pixels[lVar11].field_0.field_0;
      bVar1 = pSrc_pixels[lVar11].field_0.field_0.b;
      uVar18 = (ulong)cVar2.field_0._0_2_ & 0xffffffffffff00ff;
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar18;
      auVar3[0xc] = cVar2.field_0._3_1_;
      auVar4[8] = cVar2.field_0._2_1_;
      auVar4._0_8_ = uVar18;
      auVar4[9] = 0;
      auVar4._10_3_ = auVar3._10_3_;
      auVar6._5_8_ = 0;
      auVar6._0_5_ = auVar4._8_5_;
      auVar24._0_4_ = (undefined4)uVar18;
      auVar5[4] = cVar2.field_0._1_1_;
      auVar5._0_4_ = auVar24._0_4_;
      auVar5[5] = 0;
      auVar5._6_7_ = SUB137(auVar6 << 0x40,6);
      auVar24._4_9_ = auVar5._4_9_;
      auVar24._13_3_ = 0;
      auVar24 = pmaddwd(auVar24,ZEXT516(CONCAT14(bVar1,(uint)bVar1)));
      iVar14 = iVar14 + auVar24._0_4_;
      iVar19 = iVar19 + auVar24._4_4_;
      iVar8 = iVar8 + (uint)bVar1 * (uint)bVar1;
    }
    fVar27 = (float)(iVar8 * 0x10 - total_b * total_b);
    fVar23 = 0.0;
    fVar26 = 0.0;
    if (1e-08 < ABS(fVar27)) {
      fVar27 = 1.0 / fVar27;
      fVar23 = fVar27 * (float)(iVar14 * 0x10 - total_b * total_r);
      fVar26 = fVar27 * (float)(iVar19 * 0x10 - total_g * total_b);
    }
    local_78.c[2] = (float)min_r;
    fVar27 = ((float)total_r - (float)total_b * fVar23) * 0.0625;
    fVar22 = ((float)total_g - (float)total_b * fVar26) * 0.0625;
    fVar29 = fVar23 * local_78.c[2] + fVar27;
    fVar25 = fVar26 * local_78.c[2] + fVar22;
    fVar27 = ((float)max_r * fVar23 + fVar27) - fVar29;
    fVar23 = ((float)max_r * fVar26 + fVar22) - fVar25;
    fVar22 = fVar27 * 0.9375 + fVar29;
    fVar28 = fVar23 * 0.9375 + fVar25;
    fVar29 = fVar27 * 0.0625 + fVar29;
    fVar25 = fVar23 * 0.0625 + fVar25;
    fVar23 = (float)(max_r - min_r) * 0.9375 + local_78.c[2];
    local_78.c[2] = (float)(max_r - min_r) * 0.0625 + local_78.c[2];
  }
  local_78.c[0] = fVar29 * 0.003921569;
  local_78.c[1] = fVar25 * 0.003921569;
  local_78.c[2] = local_78.c[2] * 0.003921569;
  cov[0] = fVar22 * 0.003921569;
  cov[1] = fVar28 * 0.003921569;
  cov[2] = fVar23 * 0.003921569;
LAB_00117bc6:
  precise_round_565(&local_78,(vec3F *)cov,lr,lg,lb,hr,hg,hb);
  return;
}

Assistant:

static inline void encode_bc1_pick_initial(const color32 *pSrc_pixels, uint32_t flags, bool grayscale_flag,
			int min_r, int min_g, int min_b, int max_r, int max_g, int max_b, 
			int avg_r, int avg_g, int avg_b, int total_r, int total_g, int total_b,
			int &lr, int &lg, int &lb, int &hr, int &hg, int &hb)
	{
		if (grayscale_flag) 
		{
			const int fr = pSrc_pixels[0].r;

			// Grayscale blocks are a common enough case to specialize.
			if ((max_r - min_r) < 2)
			{
				lr = lb = hr = hb = to_5(fr);
				lg = hg = to_6(fr);
			}
			else
			{
				lr = lb = to_5(min_r);
				lg = to_6(min_r);

				hr = hb = to_5(max_r);
				hg = to_6(max_r);
			}
		}
		else if (flags & cEncodeBC1Use2DLS)
		{
			//  2D Least Squares approach from Humus's example, with added inset and optimal rounding.
			int big_chan = 0, min_chan_val = min_r, max_chan_val = max_r;
			if ((max_g - min_g) > (max_chan_val - min_chan_val))
				big_chan = 1, min_chan_val = min_g, max_chan_val = max_g;

			if ((max_b - min_b) > (max_chan_val - min_chan_val))
				big_chan = 2, min_chan_val = min_b, max_chan_val = max_b;
		
			int sum_xy_r = 0, sum_xy_g = 0, sum_xy_b = 0;
			vec3F l, h;
			if (big_chan == 0)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
					sum_xy_r += r * r, sum_xy_g += r * g, sum_xy_b += r * b;
				}

				int sum_x = total_r;
				int sum_x2 = sum_xy_r;

				float div = (float)(16 * sum_x2 - sum_x * sum_x);
				float b_y = 0.0f, b_z = 0.0f;
				if (fabs(div) > 1e-8f)
				{
					div = 1.0f / div;
					b_y = (16 * sum_xy_g - sum_x * total_g) * div;
					b_z = (16 * sum_xy_b - sum_x * total_b) * div;
				}

				float a_y = (total_g - b_y * sum_x) / 16.0f;
				float a_z = (total_b - b_z * sum_x) / 16.0f;
								
				l.c[1] = a_y + b_y * min_chan_val;
				l.c[2] = a_z + b_z * min_chan_val;

				h.c[1] = a_y + b_y * max_chan_val;
				h.c[2] = a_z + b_z * max_chan_val;

				float dg = (h.c[1] - l.c[1]);
				float db = (h.c[2] - l.c[2]);
				
				h.c[1] = l.c[1] + dg * (15.0f/16.0f);
				h.c[2] = l.c[2] + db * (15.0f/16.0f);

				l.c[1] = l.c[1] + dg * (1.0f/16.0f);
				l.c[2] = l.c[2] + db * (1.0f/16.0f);
								
				float d = (float)(max_chan_val - min_chan_val);
				float fmin_chan_val = min_chan_val + d * (1.0f/16.0f);
				float fmax_chan_val = min_chan_val + d * (15.0f/16.0f);

				l.c[0] = fmin_chan_val;
				h.c[0] = fmax_chan_val;
			}
			else if (big_chan == 1)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
					sum_xy_r += g * r, sum_xy_g += g * g, sum_xy_b += g * b;
				}

				int sum_x = total_g;
				int sum_x2 = sum_xy_g;

				float div = (float)(16 * sum_x2 - sum_x * sum_x);
				float b_x = 0.0f, b_z = 0.0f;
				if (fabs(div) > 1e-8f)
				{
					div = 1.0f / div;
					b_x = (16 * sum_xy_r - sum_x * total_r) * div;
					b_z = (16 * sum_xy_b - sum_x * total_b) * div;
				}

				float a_x = (total_r - b_x * sum_x) / 16.0f;
				float a_z = (total_b - b_z * sum_x) / 16.0f;

				l.c[0] = a_x + b_x * min_chan_val;
				l.c[2] = a_z + b_z * min_chan_val;

				h.c[0] = a_x + b_x * max_chan_val;
				h.c[2] = a_z + b_z * max_chan_val;

				float dr = (h.c[0] - l.c[0]);
				float db = (h.c[2] - l.c[2]);
				
				h.c[0] = l.c[0] + dr * (15.0f/16.0f);
				h.c[2] = l.c[2] + db * (15.0f/16.0f);

				l.c[0] = l.c[0] + dr * (1.0f/16.0f);
				l.c[2] = l.c[2] + db * (1.0f/16.0f);
								
				float d = (float)(max_chan_val - min_chan_val);
				float fmin_chan_val = min_chan_val + d * (1.0f/16.0f);
				float fmax_chan_val = min_chan_val + d * (15.0f/16.0f);

				l.c[1] = fmin_chan_val;
				h.c[1] = fmax_chan_val;
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
					sum_xy_r += b * r, sum_xy_g += b * g, sum_xy_b += b * b;
				}

				int sum_x = total_b;
				int sum_x2 = sum_xy_b;

				float div = (float)(16 * sum_x2 - sum_x * sum_x);
				float b_x = 0.0f, b_y = 0.0f;
				if (fabs(div) > 1e-8f)
				{
					div = 1.0f / div;
					b_x = (16 * sum_xy_r - sum_x * total_r) * div;
					b_y = (16 * sum_xy_g - sum_x * total_g) * div;
				}

				float a_x = (total_r - b_x * sum_x) / 16.0f;
				float a_y = (total_g - b_y * sum_x) / 16.0f;

				l.c[0] = a_x + b_x * min_chan_val;
				l.c[1] = a_y + b_y * min_chan_val;

				h.c[0] = a_x + b_x * max_chan_val;
				h.c[1] = a_y + b_y * max_chan_val;

				float dr = (h.c[0] - l.c[0]);
				float dg = (h.c[1] - l.c[1]);
				
				h.c[0] = l.c[0] + dr * (15.0f/16.0f);
				h.c[1] = l.c[1] + dg * (15.0f/16.0f);

				l.c[0] = l.c[0] + dr * (1.0f/16.0f);
				l.c[1] = l.c[1] + dg * (1.0f/16.0f);

				float d = (float)(max_chan_val - min_chan_val);
				float fmin_chan_val = min_chan_val + d * (1.0f/16.0f);
				float fmax_chan_val = min_chan_val + d * (15.0f/16.0f);

				l.c[2] = fmin_chan_val;
				h.c[2] = fmax_chan_val;
			}

			precise_round_565_noscale(l, h, lr, lg, lb, hr, hg, hb);
		}
		else if (flags & cEncodeBC1BoundingBox)
		{
			// Algorithm from icbc.h compress_dxt1_fast()
			vec3F l, h;
			l.c[0] = min_r * (1.0f/255.0f);
			l.c[1] = min_g * (1.0f/255.0f);
			l.c[2] = min_b * (1.0f/255.0f);

			h.c[0] = max_r * (1.0f/255.0f);
			h.c[1] = max_g * (1.0f/255.0f);
			h.c[2] = max_b * (1.0f/255.0f);

			const float bias = 8.0f / 255.0f;
			float inset_r = (h.c[0] - l.c[0] - bias) * (1.0f/16.0f);
			float inset_g = (h.c[1] - l.c[1] - bias) * (1.0f/16.0f);
			float inset_b = (h.c[2] - l.c[2] - bias) * (1.0f/16.0f);
			
			l.c[0] = clampf(l.c[0] + inset_r, 0.0f, 1.0f);
			l.c[1] = clampf(l.c[1] + inset_g, 0.0f, 1.0f);
			l.c[2] = clampf(l.c[2] + inset_b, 0.0f, 1.0f);

			h.c[0] = clampf(h.c[0] - inset_r, 0.0f, 1.0f);
			h.c[1] = clampf(h.c[1] - inset_g, 0.0f, 1.0f);
			h.c[2] = clampf(h.c[2] - inset_b, 0.0f, 1.0f);

			int icov_xz = 0, icov_yz = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov_xz += r * b;
				icov_yz += g * b;
			}
						 
			 if (icov_xz < 0)
				  std::swap(l.c[0], h.c[0]);

			 if (icov_yz < 0)
				  std::swap(l.c[1], h.c[1]);

			 precise_round_565(l, h, lr, lg, lb, hr, hg, hb);
		}
		else if (flags & cEncodeBC1BoundingBoxInt)
		{
			// Algorithm from icbc.h compress_dxt1_fast(), but converted to integer.
			int inset_r = (max_r - min_r - 8) >> 4;
			int inset_g = (max_g - min_g - 8) >> 4;
			int inset_b = (max_b - min_b - 8) >> 4;

			min_r += inset_r;
			min_g += inset_g;
			min_b += inset_b;
			if ((uint32_t)(min_r | min_g | min_b) > 255U)
			{
				min_r = clampi(min_r, 0, 255);
				min_g = clampi(min_g, 0, 255);
				min_b = clampi(min_b, 0, 255);
			}

			max_r -= inset_r;
			max_g -= inset_g;
			max_b -= inset_b;
			if ((uint32_t)(max_r | max_g | max_b) > 255U)
			{
				max_r = clampi(max_r, 0, 255);
				max_g = clampi(max_g, 0, 255);
				max_b = clampi(max_b, 0, 255);
			}

			int icov_xz = 0, icov_yz = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov_xz += r * b;
				icov_yz += g * b;
			}

			 int x0 = min_r;
			 int y0 = min_g;
			 int x1 = max_r;
			 int y1 = max_g;

			 if (icov_xz < 0)
				  std::swap(x0, x1);

			 if (icov_yz < 0)
				  std::swap(y0, y1);
			 
			 lr = to_5(x0);
			 lg = to_6(y0);
			 lb = to_5(min_b);

			 hr = to_5(x1);
			 hg = to_6(y1);
			 hb = to_5(max_b);
		}
		else
		{
			// Select 2 colors along the principle axis. (There must be a faster/simpler way.)
			uint32_t low_c = 0, high_c = 0;

			int icov[6] = { 0, 0, 0, 0, 0, 0 };
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov[0] += r * r;
				icov[1] += r * g;
				icov[2] += r * b;
				icov[3] += g * g;
				icov[4] += g * b;
				icov[5] += b * b;
			}
			
			int saxis_r = 306, saxis_g = 601, saxis_b = 117;

			float xr = (float)(max_r - min_r);
			float xg = (float)(max_g - min_g);
			float xb = (float)(max_b - min_b);

			if (icov[2] < 0)
				xr = -xr;

			if (icov[4] < 0)
				xg = -xg;
						
			float cov[6];
			for (uint32_t i = 0; i < 6; i++)
				cov[i] = (float)(icov[i]) * (1.0f / 255.0f);

			const uint32_t total_power_iters = (flags & cEncodeBC1Use6PowerIters) ? 6 : 4;
			for (uint32_t power_iter = 0; power_iter < total_power_iters; power_iter++)
			{
				float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
				float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
				float b = xr * cov[2] + xg * cov[4] + xb * cov[5];
				xr = r; xg = g; xb = b;
			}

			float k = maximum(fabsf(xr), fabsf(xg), fabsf(xb));
			if (k >= 2)
			{
				float m = 2048.0f / k;
				saxis_r = (int)(xr * m);
				saxis_g = (int)(xg * m);
				saxis_b = (int)(xb * m);
			}
												
			int low_dot = INT_MAX, high_dot = INT_MIN;

			saxis_r = (int)((uint32_t)saxis_r << 4U);
			saxis_g = (int)((uint32_t)saxis_g << 4U);
			saxis_b = (int)((uint32_t)saxis_b << 4U);
			
			for (uint32_t i = 0; i < 16; i += 4)
			{
				int dot0 = ((pSrc_pixels[i].r * saxis_r + pSrc_pixels[i].g * saxis_g + pSrc_pixels[i].b * saxis_b) & ~0xF) + i;
				int dot1 = ((pSrc_pixels[i + 1].r * saxis_r + pSrc_pixels[i + 1].g * saxis_g + pSrc_pixels[i + 1].b * saxis_b) & ~0xF) + i + 1;
				int dot2 = ((pSrc_pixels[i + 2].r * saxis_r + pSrc_pixels[i + 2].g * saxis_g + pSrc_pixels[i + 2].b * saxis_b) & ~0xF) + i + 2;
				int dot3 = ((pSrc_pixels[i + 3].r * saxis_r + pSrc_pixels[i + 3].g * saxis_g + pSrc_pixels[i + 3].b * saxis_b) & ~0xF) + i + 3;

				int min_d01 = std::min(dot0, dot1);
				int max_d01 = std::max(dot0, dot1);

				int min_d23 = std::min(dot2, dot3);
				int max_d23 = std::max(dot2, dot3);

				int min_d = std::min(min_d01, min_d23);
				int max_d = std::max(max_d01, max_d23);

				low_dot = std::min(low_dot, min_d);
				high_dot = std::max(high_dot, max_d);
			}
			low_c = low_dot & 15;
			high_c = high_dot & 15;

			lr = to_5(pSrc_pixels[low_c].r);
			lg = to_6(pSrc_pixels[low_c].g);
			lb = to_5(pSrc_pixels[low_c].b);

			hr = to_5(pSrc_pixels[high_c].r);
			hg = to_6(pSrc_pixels[high_c].g);
			hb = to_5(pSrc_pixels[high_c].b);
		}
	}